

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O2

DeviceFeatures *
Diligent::VkFeaturesToDeviceFeatures
          (DeviceFeatures *__return_storage_ptr__,uint32_t vkVersion,
          VkPhysicalDeviceFeatures *vkFeatures,VkPhysicalDeviceProperties *vkDeviceProps,
          ExtensionFeatures *ExtFeatures,ExtensionProperties *ExtProps,
          DEVICE_FEATURE_STATE OptionalState)

{
  undefined4 uVar1;
  undefined4 uVar2;
  VkBool32 VVar3;
  uint uVar4;
  DEVICE_FEATURE_STATE DVar5;
  DEVICE_FEATURE_STATE DVar6;
  uint uVar7;
  bool bVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  string msg;
  string local_50;
  
  if (OptionalState == DEVICE_FEATURE_STATE_DISABLED) {
    FormatString<char[26],char[47]>
              (&local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"OptionalState != DEVICE_FEATURE_STATE_DISABLED",
               (char (*) [47])vkDeviceProps);
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"VkFeaturesToDeviceFeatures",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x79e);
    std::__cxx11::string::~string((string *)&local_50);
  }
  __return_storage_ptr__->MeshShaders = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->RayTracing = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->BindlessResources = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->OcclusionQueries = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->BinaryOcclusionQueries = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->TimestampQueries = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->PipelineStatisticsQueries = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->DurationQueries = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->DepthBiasClamp = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->DepthClamp = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->IndependentBlend = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->DualSourceBlend = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->MultiViewport = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->TextureCompressionBC = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->TextureCompressionETC2 = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->VertexPipelineUAVWritesAndAtomics = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->PixelUAVWritesAndAtomics = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->TextureUAVExtendedFormats = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->ShaderFloat16 = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->ResourceBuffer16BitAccess = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->UniformBuffer16BitAccess = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->ShaderInputOutput16 = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->ShaderInt8 = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->ResourceBuffer8BitAccess = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->UniformBuffer8BitAccess = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->ShaderResourceStaticArrays = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->ShaderResourceRuntimeArrays = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->WaveOp = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->InstanceDataStepRate = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->NativeFence = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->TileShaders = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->TransferQueueTimestampQueries = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->TileShaders = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->TransferQueueTimestampQueries = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->VariableRateShading = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->SparseResources = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->SubpassFramebufferFetch = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->TextureComponentSwizzle = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->TextureSubresourceViews = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->NativeMultiDraw = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->SeparablePrograms = DEVICE_FEATURE_STATE_ENABLED;
  __return_storage_ptr__->ShaderResourceQueries = DEVICE_FEATURE_STATE_ENABLED;
  __return_storage_ptr__->MultithreadedResourceCreation = DEVICE_FEATURE_STATE_ENABLED;
  __return_storage_ptr__->ComputeShaders = DEVICE_FEATURE_STATE_ENABLED;
  __return_storage_ptr__->BindlessResources = DEVICE_FEATURE_STATE_ENABLED;
  __return_storage_ptr__->BinaryOcclusionQueries = DEVICE_FEATURE_STATE_ENABLED;
  __return_storage_ptr__->ShaderResourceStaticArrays = DEVICE_FEATURE_STATE_ENABLED;
  __return_storage_ptr__->SubpassFramebufferFetch = DEVICE_FEATURE_STATE_ENABLED;
  __return_storage_ptr__->TextureComponentSwizzle = DEVICE_FEATURE_STATE_ENABLED;
  __return_storage_ptr__->TextureSubresourceViews = DEVICE_FEATURE_STATE_ENABLED;
  __return_storage_ptr__->AsyncShaderCompilation = DEVICE_FEATURE_STATE_ENABLED;
  __return_storage_ptr__->FormattedBuffers = DEVICE_FEATURE_STATE_ENABLED;
  bVar8 = (vkDeviceProps->limits).timestampComputeAndGraphics != 0;
  __return_storage_ptr__->TimestampQueries = bVar8;
  __return_storage_ptr__->DurationQueries = bVar8;
  DVar6 = (DEVICE_FEATURE_STATE)vkFeatures->geometryShader;
  if (vkFeatures->geometryShader != 0) {
    DVar6 = OptionalState;
  }
  __return_storage_ptr__->GeometryShaders = DVar6;
  DVar6 = (DEVICE_FEATURE_STATE)vkFeatures->tessellationShader;
  if (vkFeatures->tessellationShader != 0) {
    DVar6 = OptionalState;
  }
  __return_storage_ptr__->Tessellation = DVar6;
  DVar6 = (DEVICE_FEATURE_STATE)vkFeatures->pipelineStatisticsQuery;
  if (vkFeatures->pipelineStatisticsQuery != 0) {
    DVar6 = OptionalState;
  }
  __return_storage_ptr__->PipelineStatisticsQueries = DVar6;
  DVar6 = (DEVICE_FEATURE_STATE)vkFeatures->occlusionQueryPrecise;
  if (vkFeatures->occlusionQueryPrecise != 0) {
    DVar6 = OptionalState;
  }
  __return_storage_ptr__->OcclusionQueries = DVar6;
  DVar6 = (DEVICE_FEATURE_STATE)vkFeatures->fillModeNonSolid;
  if (vkFeatures->fillModeNonSolid != 0) {
    DVar6 = OptionalState;
  }
  __return_storage_ptr__->WireframeFill = DVar6;
  uVar1 = vkFeatures->depthClamp;
  uVar2 = vkFeatures->depthBiasClamp;
  auVar11._0_4_ = -(uint)(vkFeatures->multiViewport == 0);
  auVar11._4_4_ = -(uint)(vkFeatures->textureCompressionBC == 0);
  auVar11._8_4_ = -(uint)(vkFeatures->textureCompressionETC2 == 0);
  auVar11._12_4_ = -(uint)(vkFeatures->vertexPipelineStoresAndAtomics == 0);
  auVar10._0_4_ = -(uint)(uVar2 == 0);
  auVar10._4_4_ = -(uint)(uVar1 == 0);
  auVar10._8_4_ = -(uint)(vkFeatures->independentBlend == 0);
  auVar10._12_4_ = -(uint)(vkFeatures->dualSrcBlend == 0);
  auVar10 = packssdw(auVar10,auVar11);
  auVar11 = packsswb(auVar10,auVar10);
  auVar10 = pshuflw(ZEXT216(CONCAT11(OptionalState,OptionalState)),
                    ZEXT216(CONCAT11(OptionalState,OptionalState)),0);
  uVar9 = ~auVar11._0_8_ & auVar10._0_8_;
  __return_storage_ptr__->DepthBiasClamp = (char)uVar9;
  __return_storage_ptr__->DepthClamp = (char)(uVar9 >> 8);
  __return_storage_ptr__->IndependentBlend = (char)(uVar9 >> 0x10);
  __return_storage_ptr__->DualSourceBlend = (char)(uVar9 >> 0x18);
  __return_storage_ptr__->MultiViewport = (char)(uVar9 >> 0x20);
  __return_storage_ptr__->TextureCompressionBC = (char)(uVar9 >> 0x28);
  __return_storage_ptr__->TextureCompressionETC2 = (char)(uVar9 >> 0x30);
  __return_storage_ptr__->VertexPipelineUAVWritesAndAtomics = (char)(uVar9 >> 0x38);
  uVar4 = (uint)OptionalState;
  DVar6 = (DEVICE_FEATURE_STATE)vkFeatures->fragmentStoresAndAtomics;
  if (vkFeatures->fragmentStoresAndAtomics != 0) {
    DVar6 = OptionalState;
  }
  __return_storage_ptr__->PixelUAVWritesAndAtomics = DVar6;
  uVar7 = vkFeatures->shaderStorageImageExtendedFormats;
  if (vkFeatures->shaderStorageImageExtendedFormats != 0) {
    uVar7 = uVar4;
  }
  __return_storage_ptr__->TextureUAVExtendedFormats = (DEVICE_FEATURE_STATE)uVar7;
  DVar6 = DEVICE_FEATURE_STATE_DISABLED;
  if ((vkFeatures->sparseBinding != 0) &&
     (DVar6 = DEVICE_FEATURE_STATE_DISABLED,
     vkFeatures->sparseResidencyImage2D != 0 || vkFeatures->sparseResidencyBuffer != 0)) {
    DVar6 = OptionalState;
  }
  __return_storage_ptr__->SparseResources = DVar6;
  uVar7 = (ExtFeatures->MeshShader).meshShader;
  if (uVar7 != 0) {
    uVar7 = (uint)OptionalState;
  }
  DVar6 = (DEVICE_FEATURE_STATE)uVar7;
  if ((ExtFeatures->MeshShader).taskShader == 0) {
    DVar6 = DEVICE_FEATURE_STATE_DISABLED;
  }
  __return_storage_ptr__->MeshShaders = DVar6;
  VVar3 = (ExtFeatures->ShaderFloat16Int8).shaderFloat16;
  DVar6 = (DEVICE_FEATURE_STATE)VVar3;
  if (VVar3 != 0) {
    DVar6 = OptionalState;
  }
  __return_storage_ptr__->ShaderFloat16 = DVar6;
  VVar3 = (ExtFeatures->ShaderFloat16Int8).shaderInt8;
  DVar6 = (DEVICE_FEATURE_STATE)VVar3;
  if (VVar3 != 0) {
    DVar6 = OptionalState;
  }
  __return_storage_ptr__->ShaderInt8 = DVar6;
  VVar3 = (ExtFeatures->Storage16Bit).storageBuffer16BitAccess;
  uVar7 = vkFeatures->shaderInt16;
  if (vkFeatures->shaderInt16 != 0) {
    uVar7 = uVar4;
  }
  DVar6 = (DEVICE_FEATURE_STATE)uVar7;
  DVar5 = (DEVICE_FEATURE_STATE)VVar3;
  if (VVar3 != 0) {
    DVar5 = DVar6;
  }
  __return_storage_ptr__->ResourceBuffer16BitAccess = DVar5;
  VVar3 = (ExtFeatures->Storage16Bit).uniformAndStorageBuffer16BitAccess;
  DVar5 = (DEVICE_FEATURE_STATE)VVar3;
  if (VVar3 != 0) {
    DVar5 = DVar6;
  }
  __return_storage_ptr__->UniformBuffer16BitAccess = DVar5;
  if ((ExtFeatures->Storage16Bit).storageInputOutput16 == 0) {
    DVar6 = DEVICE_FEATURE_STATE_DISABLED;
  }
  __return_storage_ptr__->ShaderInputOutput16 = DVar6;
  VVar3 = (ExtFeatures->Storage8Bit).storageBuffer8BitAccess;
  DVar6 = (DEVICE_FEATURE_STATE)VVar3;
  if (VVar3 != 0) {
    DVar6 = OptionalState;
  }
  __return_storage_ptr__->ResourceBuffer8BitAccess = DVar6;
  VVar3 = (ExtFeatures->Storage8Bit).uniformAndStorageBuffer8BitAccess;
  DVar6 = (DEVICE_FEATURE_STATE)VVar3;
  if (VVar3 != 0) {
    DVar6 = OptionalState;
  }
  __return_storage_ptr__->UniformBuffer8BitAccess = DVar6;
  uVar7 = (ExtFeatures->DescriptorIndexing).runtimeDescriptorArray;
  if (uVar7 != 0) {
    uVar7 = uVar4;
  }
  __return_storage_ptr__->ShaderResourceRuntimeArrays = (DEVICE_FEATURE_STATE)uVar7;
  if ((vkVersion < 0x401000) || ((ExtFeatures->AccelStruct).accelerationStructure == 0)) {
    __return_storage_ptr__->RayTracing = DEVICE_FEATURE_STATE_DISABLED;
    if (0x400fff < vkVersion) goto LAB_0025df1a;
  }
  else {
    DVar6 = DEVICE_FEATURE_STATE_DISABLED;
    if ((ExtFeatures->RayQuery).rayQuery != 0 ||
        (ExtFeatures->RayTracingPipeline).rayTracingPipeline != 0) {
      DVar6 = OptionalState;
    }
    __return_storage_ptr__->RayTracing = DVar6;
LAB_0025df1a:
    if (((ExtProps->Subgroup).supportedOperations & 1) != 0) {
      DVar6 = (byte)(ExtProps->Subgroup).supportedStages >> 5 & DEVICE_FEATURE_STATE_ENABLED;
      goto LAB_0025df35;
    }
  }
  DVar6 = DEVICE_FEATURE_STATE_DISABLED;
LAB_0025df35:
  __return_storage_ptr__->WaveOp = DVar6;
  uVar4 = (ExtFeatures->VertexAttributeDivisor).vertexAttributeInstanceRateZeroDivisor;
  if (uVar4 != 0) {
    uVar4 = (uint)OptionalState;
  }
  DVar6 = (DEVICE_FEATURE_STATE)uVar4;
  if ((ExtFeatures->VertexAttributeDivisor).vertexAttributeInstanceRateDivisor == 0) {
    DVar6 = DEVICE_FEATURE_STATE_DISABLED;
  }
  __return_storage_ptr__->InstanceDataStepRate = DVar6;
  VVar3 = (ExtFeatures->TimelineSemaphore).timelineSemaphore;
  DVar6 = (DEVICE_FEATURE_STATE)VVar3;
  if (VVar3 != 0) {
    DVar6 = OptionalState;
  }
  __return_storage_ptr__->NativeFence = DVar6;
  __return_storage_ptr__->TileShaders = DEVICE_FEATURE_STATE_DISABLED;
  VVar3 = (ExtFeatures->HostQueryReset).hostQueryReset;
  DVar6 = (DEVICE_FEATURE_STATE)VVar3;
  if (VVar3 != 0) {
    DVar6 = OptionalState;
  }
  __return_storage_ptr__->TransferQueueTimestampQueries = DVar6;
  DVar6 = DEVICE_FEATURE_STATE_DISABLED;
  if (((ExtFeatures->FragmentDensityMap).fragmentDensityMap != 0 ||
      (ExtFeatures->ShadingRate).attachmentFragmentShadingRate != 0) ||
      ((ExtFeatures->ShadingRate).primitiveFragmentShadingRate != 0 ||
      (ExtFeatures->ShadingRate).pipelineFragmentShadingRate != 0)) {
    DVar6 = OptionalState;
  }
  __return_storage_ptr__->VariableRateShading = DVar6;
  if ((ExtFeatures->ShaderDrawParameters).shaderDrawParameters == 0) {
    OptionalState = DEVICE_FEATURE_STATE_DISABLED;
  }
  if ((ExtFeatures->MultiDraw).multiDraw == 0) {
    OptionalState = DEVICE_FEATURE_STATE_DISABLED;
  }
  __return_storage_ptr__->NativeMultiDraw = OptionalState;
  return __return_storage_ptr__;
}

Assistant:

DeviceFeatures VkFeaturesToDeviceFeatures(uint32_t                                                          vkVersion,
                                          const VkPhysicalDeviceFeatures&                                   vkFeatures,
                                          const VkPhysicalDeviceProperties&                                 vkDeviceProps,
                                          const VulkanUtilities::VulkanPhysicalDevice::ExtensionFeatures&   ExtFeatures,
                                          const VulkanUtilities::VulkanPhysicalDevice::ExtensionProperties& ExtProps,
                                          DEVICE_FEATURE_STATE                                              OptionalState)
{
    VERIFY_EXPR(OptionalState != DEVICE_FEATURE_STATE_DISABLED);

    DeviceFeatures Features;

    // Enable features
#define INIT_FEATURE(FeatureName, Supported) \
    Features.FeatureName = (Supported) ? OptionalState : DEVICE_FEATURE_STATE_DISABLED

    // The following features are always enabled
    Features.SeparablePrograms             = DEVICE_FEATURE_STATE_ENABLED;
    Features.ShaderResourceQueries         = DEVICE_FEATURE_STATE_ENABLED;
    Features.MultithreadedResourceCreation = DEVICE_FEATURE_STATE_ENABLED;
    Features.ComputeShaders                = DEVICE_FEATURE_STATE_ENABLED;
    Features.BindlessResources             = DEVICE_FEATURE_STATE_ENABLED;
    Features.BinaryOcclusionQueries        = DEVICE_FEATURE_STATE_ENABLED;
    Features.ShaderResourceStaticArrays    = DEVICE_FEATURE_STATE_ENABLED;
    Features.SubpassFramebufferFetch       = DEVICE_FEATURE_STATE_ENABLED;
    Features.TextureComponentSwizzle       = DEVICE_FEATURE_STATE_ENABLED;
    Features.TextureSubresourceViews       = DEVICE_FEATURE_STATE_ENABLED;
    Features.AsyncShaderCompilation        = DEVICE_FEATURE_STATE_ENABLED;
    Features.FormattedBuffers              = DEVICE_FEATURE_STATE_ENABLED;

    // Timestamps are not a feature and can't be disabled. They are either supported by the device, or not.
    Features.TimestampQueries = vkDeviceProps.limits.timestampComputeAndGraphics ? DEVICE_FEATURE_STATE_ENABLED : DEVICE_FEATURE_STATE_DISABLED;
    Features.DurationQueries  = vkDeviceProps.limits.timestampComputeAndGraphics ? DEVICE_FEATURE_STATE_ENABLED : DEVICE_FEATURE_STATE_DISABLED;

    // clang-format off
    INIT_FEATURE(GeometryShaders,                   vkFeatures.geometryShader);
    INIT_FEATURE(Tessellation,                      vkFeatures.tessellationShader);
    INIT_FEATURE(PipelineStatisticsQueries,         vkFeatures.pipelineStatisticsQuery);
    INIT_FEATURE(OcclusionQueries,                  vkFeatures.occlusionQueryPrecise);
    INIT_FEATURE(WireframeFill,                     vkFeatures.fillModeNonSolid);
    INIT_FEATURE(DepthBiasClamp,                    vkFeatures.depthBiasClamp);
    INIT_FEATURE(DepthClamp,                        vkFeatures.depthClamp);
    INIT_FEATURE(IndependentBlend,                  vkFeatures.independentBlend);
    INIT_FEATURE(DualSourceBlend,                   vkFeatures.dualSrcBlend);
    INIT_FEATURE(MultiViewport,                     vkFeatures.multiViewport);
    INIT_FEATURE(TextureCompressionBC,              vkFeatures.textureCompressionBC);
    INIT_FEATURE(TextureCompressionETC2,            vkFeatures.textureCompressionETC2);
    INIT_FEATURE(VertexPipelineUAVWritesAndAtomics, vkFeatures.vertexPipelineStoresAndAtomics);
    INIT_FEATURE(PixelUAVWritesAndAtomics,          vkFeatures.fragmentStoresAndAtomics);
    INIT_FEATURE(TextureUAVExtendedFormats,         vkFeatures.shaderStorageImageExtendedFormats);
    INIT_FEATURE(SparseResources,                   vkFeatures.sparseBinding && (vkFeatures.sparseResidencyBuffer || vkFeatures.sparseResidencyImage2D)); // requires support for resident resources
    // clang-format on

    const VkPhysicalDeviceMeshShaderFeaturesEXT& MeshShaderFeats = ExtFeatures.MeshShader;
    INIT_FEATURE(MeshShaders, MeshShaderFeats.taskShader != VK_FALSE && MeshShaderFeats.meshShader != VK_FALSE);

    const VkPhysicalDeviceShaderFloat16Int8FeaturesKHR& ShaderFloat16Int8Feats = ExtFeatures.ShaderFloat16Int8;
    // clang-format off
    INIT_FEATURE(ShaderFloat16, ShaderFloat16Int8Feats.shaderFloat16 != VK_FALSE);
    INIT_FEATURE(ShaderInt8,    ShaderFloat16Int8Feats.shaderInt8    != VK_FALSE);
    // clang-format on

    const VkPhysicalDevice16BitStorageFeaturesKHR& Storage16BitFeats = ExtFeatures.Storage16Bit;
    // clang-format off
    INIT_FEATURE(ResourceBuffer16BitAccess, Storage16BitFeats.storageBuffer16BitAccess           != VK_FALSE && vkFeatures.shaderInt16 != VK_FALSE);
    INIT_FEATURE(UniformBuffer16BitAccess,  Storage16BitFeats.uniformAndStorageBuffer16BitAccess != VK_FALSE && vkFeatures.shaderInt16 != VK_FALSE);
    INIT_FEATURE(ShaderInputOutput16,       Storage16BitFeats.storageInputOutput16               != VK_FALSE && vkFeatures.shaderInt16 != VK_FALSE);
    // clang-format on

    const VkPhysicalDevice8BitStorageFeaturesKHR& Storage8BitFeats = ExtFeatures.Storage8Bit;
    // clang-format off
    INIT_FEATURE(ResourceBuffer8BitAccess, Storage8BitFeats.storageBuffer8BitAccess           != VK_FALSE);
    INIT_FEATURE(UniformBuffer8BitAccess,  Storage8BitFeats.uniformAndStorageBuffer8BitAccess != VK_FALSE);
    // clang-format on

    const VkPhysicalDeviceDescriptorIndexingFeaturesEXT& DescrIndexingFeats = ExtFeatures.DescriptorIndexing;
    INIT_FEATURE(ShaderResourceRuntimeArrays, DescrIndexingFeats.runtimeDescriptorArray != VK_FALSE);
    const VkPhysicalDeviceAccelerationStructureFeaturesKHR& AccelStructFeats = ExtFeatures.AccelStruct;
    const VkPhysicalDeviceRayTracingPipelineFeaturesKHR&    RayTracingFeats  = ExtFeatures.RayTracingPipeline;
    const VkPhysicalDeviceRayQueryFeaturesKHR&              RayQueryFeats    = ExtFeatures.RayQuery;
    // clang-format off
    INIT_FEATURE(RayTracing,
                 vkVersion                              >= VK_API_VERSION_1_1 &&
                 AccelStructFeats.accelerationStructure != VK_FALSE           &&
                 (RayTracingFeats.rayTracingPipeline != VK_FALSE || RayQueryFeats.rayQuery != VK_FALSE));
    // clang-format on

    const VkPhysicalDeviceSubgroupProperties& SubgroupProps          = ExtProps.Subgroup;
    const VkSubgroupFeatureFlagBits           RequiredSubgroupFeats  = VK_SUBGROUP_FEATURE_BASIC_BIT;
    const VkShaderStageFlagBits               RequiredSubgroupStages = VK_SHADER_STAGE_COMPUTE_BIT;
    Features.WaveOp =
        (vkVersion >= VK_API_VERSION_1_1 &&
         (SubgroupProps.supportedOperations & RequiredSubgroupFeats) == RequiredSubgroupFeats &&
         (SubgroupProps.supportedStages & RequiredSubgroupStages) == RequiredSubgroupStages) ?
        DEVICE_FEATURE_STATE_ENABLED :
        DEVICE_FEATURE_STATE_DISABLED;

    const VkPhysicalDeviceVertexAttributeDivisorFeaturesEXT& VertexAttribDivisorFeats = ExtFeatures.VertexAttributeDivisor;
    INIT_FEATURE(InstanceDataStepRate,
                 (VertexAttribDivisorFeats.vertexAttributeInstanceRateDivisor != VK_FALSE &&
                  VertexAttribDivisorFeats.vertexAttributeInstanceRateZeroDivisor != VK_FALSE));

    const VkPhysicalDeviceTimelineSemaphoreFeaturesKHR& TimelineSemaphoreFeats = ExtFeatures.TimelineSemaphore;
    INIT_FEATURE(NativeFence,
                 TimelineSemaphoreFeats.timelineSemaphore != VK_FALSE);

    INIT_FEATURE(TileShaders, false); // Not currently supported

    INIT_FEATURE(TransferQueueTimestampQueries,
                 ExtFeatures.HostQueryReset.hostQueryReset != VK_FALSE);

    INIT_FEATURE(VariableRateShading,
                 (ExtFeatures.ShadingRate.pipelineFragmentShadingRate != VK_FALSE ||
                  ExtFeatures.ShadingRate.primitiveFragmentShadingRate != VK_FALSE ||
                  ExtFeatures.ShadingRate.attachmentFragmentShadingRate != VK_FALSE ||
                  ExtFeatures.FragmentDensityMap.fragmentDensityMap != VK_FALSE));

    INIT_FEATURE(NativeMultiDraw,
                 ExtFeatures.MultiDraw.multiDraw != VK_FALSE && ExtFeatures.ShaderDrawParameters.shaderDrawParameters != VK_FALSE);

#undef INIT_FEATURE

    ASSERT_SIZEOF(DeviceFeatures, 47, "Did you add a new feature to DeviceFeatures? Please handle its status here (if necessary).");

    return Features;
}